

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void linenoiseEditHistoryNext(linenoiseState *l,int dir)

{
  char **ppcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  
  iVar2 = history_len;
  ppcVar1 = history;
  if (1 < history_len) {
    free(history[~l->history_index + history_len]);
    pcVar4 = strdup(l->buf);
    uVar3 = l->history_index;
    ppcVar1[(int)(~uVar3 + iVar2)] = pcVar4;
    uVar3 = (uint)(dir == 1) * 2 + -1 + uVar3;
    l->history_index = uVar3;
    if ((int)uVar3 < 0) {
      l->history_index = 0;
    }
    else {
      if (uVar3 < (uint)iVar2) {
        strncpy(l->buf,ppcVar1[(int)(iVar2 + ~uVar3)],l->buflen);
        l->buf[l->buflen - 1] = '\0';
        sVar5 = strlen(l->buf);
        l->pos = sVar5;
        l->len = sVar5;
        refreshLine(l);
        return;
      }
      l->history_index = iVar2 + -1;
    }
  }
  return;
}

Assistant:

static void linenoiseEditHistoryNext(struct linenoiseState * l, int dir) {
    if (history_len > 1) {
        /* Update the current history entry before to
         * overwrite it with the next one. */
        free(history[history_len - 1 - l->history_index]);
        history[history_len - 1 - l->history_index] = strdup(l->buf);
        /* Show the new entry */
        l->history_index += (dir == LINENOISE_HISTORY_PREV) ? 1 : -1;
        if (l->history_index < 0) {
            l->history_index = 0;
            return;
        } else if (l->history_index >= history_len) {
            l->history_index = history_len-1;
            return;
        }
        strncpy(l->buf,history[history_len - 1 - l->history_index],l->buflen);
        l->buf[l->buflen-1] = '\0';
        l->len = l->pos = strlen(l->buf);
        refreshLine(l);
    }
}